

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

void nn_bws_destroy(void *self)

{
  long in_RDI;
  nn_bws *bws;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_BWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0xaa);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)0x16e8bc);
  if (*(long *)(in_RDI + 0x2c8) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bws->aws == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0xac);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_usock_term((nn_usock *)0x16e930);
  nn_fsm_term((nn_fsm *)0x16e93a);
  nn_free((void *)0x16e944);
  return;
}

Assistant:

static void nn_bws_destroy (void *self)
{
    struct nn_bws *bws = self;

    nn_assert_state (bws, NN_BWS_STATE_IDLE);
    nn_list_term (&bws->awss);
    nn_assert (bws->aws == NULL);
    nn_usock_term (&bws->usock);
    nn_fsm_term (&bws->fsm);

    nn_free (bws);
}